

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.c
# Opt level: O2

_node_t * create_node(void)

{
  _node_t *p_Var1;
  
  p_Var1 = (_node_t *)mmalloc(0x48);
  p_Var1->type = 0;
  p_Var1->num_children = 0;
  p_Var1->parent = (_node_s *)0x0;
  p_Var1->children = (_node_s **)0x0;
  return p_Var1;
}

Assistant:

_node_t* create_node()
{
    _node_t* new = (_node_t*)mmalloc(sizeof(_node_t));

    new->type = 0;
    new->num_children = 0;
    new->parent = NULL;
    new->children = NULL;
    return new;
}